

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

void cmSystemTools::ReportLastSystemError(char *msg)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string m;
  string local_98;
  long *local_78;
  undefined8 local_70;
  long local_68 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  long *local_20;
  long **local_18;
  
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  local_58.first._M_len = strlen(msg);
  local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_40 = 0x10;
  local_38 = ": System Error: ";
  local_30 = 0;
  local_28 = local_70;
  local_20 = local_78;
  views._M_len = 3;
  views._M_array = &local_58;
  local_58.first._M_str = msg;
  local_18 = &local_78;
  cmCatViews(&local_98,views);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  Error(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m =
    cmStrCat(msg, ": System Error: ", Superclass::GetLastSystemError());
  cmSystemTools::Error(m);
}